

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool Curl_pipeline_checkget_write(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((conn->bits).multiplex & 1U) == 0) {
    if (((conn->writechannel_inuse & 1U) == 0) && (_Var1 = Curl_sendpipe_head(data,conn), _Var1)) {
      conn->writechannel_inuse = true;
      data_local._7_1_ = true;
    }
    else {
      data_local._7_1_ = false;
    }
  }
  else {
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_pipeline_checkget_write(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  if(conn->bits.multiplex)
    /* when multiplexing, we can use it at once */
    return TRUE;

  if(!conn->writechannel_inuse && Curl_sendpipe_head(data, conn)) {
    /* Grab the channel */
    conn->writechannel_inuse = TRUE;
    return TRUE;
  }
  return FALSE;
}